

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void clear_list(list *list,_Bool destroy)

{
  node *pnVar1;
  node *next;
  node *node;
  _Bool destroy_local;
  list *list_local;
  
  pnVar1 = list->head;
  while (next = pnVar1, next != (node *)0x0) {
    pnVar1 = next->next;
    list_remove(list,next);
    if (destroy) {
      node_destroy(next);
    }
  }
  return;
}

Assistant:

static void clear_list(struct list *list, bool destroy)
{
        struct node *node = list->head;
        struct node *next = NULL;

        while (node != NULL) {
                next = node->next;

                list_remove(list, node);

                if (destroy) {
                        node_destroy(node);
                }

                node = next;
        }
}